

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestRegistry.cpp
# Opt level: O2

void __thiscall TestRegistry::listTestGroupAndCaseNames(TestRegistry *this,TestResult *result)

{
  UtestShell *this_00;
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  char *pcVar3;
  SimpleString groupAndNameList;
  SimpleString groupAndName;
  SimpleString local_60;
  SimpleString local_50 [2];
  UtestShell *test;
  
  SimpleString::SimpleString(&local_60,"");
  this_00 = (UtestShell *)(local_50 + 1);
  test = this->tests_;
  while (test != (UtestShell *)0x0) {
    bVar1 = testShouldRun(this,test,result);
    if (bVar1) {
      SimpleString::SimpleString(local_50,"");
      SimpleString::operator+=(local_50,"#");
      UtestShell::getGroup(this_00);
      SimpleString::operator+=(local_50,(SimpleString *)this_00);
      SimpleString::~SimpleString((SimpleString *)this_00);
      SimpleString::operator+=(local_50,".");
      UtestShell::getName(this_00);
      SimpleString::operator+=(local_50,(SimpleString *)this_00);
      SimpleString::~SimpleString((SimpleString *)this_00);
      SimpleString::operator+=(local_50,"#");
      bVar1 = SimpleString::contains(&local_60,local_50);
      if (!bVar1) {
        SimpleString::operator+=(&local_60,local_50);
        SimpleString::operator+=(&local_60," ");
      }
      SimpleString::~SimpleString(local_50);
    }
    iVar2 = (*test->_vptr_UtestShell[3])(test);
    test = (UtestShell *)CONCAT44(extraout_var,iVar2);
  }
  SimpleString::replace(&local_60,"#","");
  SimpleString::SimpleString(local_50," ");
  bVar1 = SimpleString::endsWith(&local_60,local_50);
  SimpleString::~SimpleString(local_50);
  if (bVar1) {
    SimpleString::size(&local_60);
    SimpleString::subString(local_50,(size_t)&local_60,0);
    SimpleString::operator=(&local_60,local_50);
    SimpleString::~SimpleString(local_50);
  }
  pcVar3 = SimpleString::asCharString(&local_60);
  (*result->_vptr_TestResult[0xe])(result,pcVar3);
  SimpleString::~SimpleString(&local_60);
  return;
}

Assistant:

void TestRegistry::listTestGroupAndCaseNames(TestResult& result)
{
    SimpleString groupAndNameList;

    for (UtestShell *test = tests_; test != NULLPTR; test = test->getNext()) {
        if (testShouldRun(test, result)) {
            SimpleString groupAndName;
            groupAndName += "#";
            groupAndName += test->getGroup();
            groupAndName += ".";
            groupAndName += test->getName();
            groupAndName += "#";

            if (!groupAndNameList.contains(groupAndName)) {
                groupAndNameList += groupAndName;
                groupAndNameList += " ";
            }
        }
    }

    groupAndNameList.replace("#", "");

    if (groupAndNameList.endsWith(" "))
        groupAndNameList = groupAndNameList.subString(0, groupAndNameList.size() - 1);
    result.print(groupAndNameList.asCharString());
}